

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O3

TRef lj_ir_ktrace(jit_State *J)

{
  uint uVar1;
  IRRef IVar2;
  
  IVar2 = (J->cur).nk;
  uVar1 = IVar2 - 2;
  if (uVar1 < J->irbotlim) {
    lj_ir_growbot(J);
  }
  (J->cur).nk = uVar1;
  (J->cur).ir[uVar1] = (IRIns)0x1c0900000000;
  return IVar2 + 0x8fffffe;
}

Assistant:

TRef lj_ir_ktrace(jit_State *J)
{
  IRRef ref = ir_nextkgc(J);
  IRIns *ir = IR(ref);
  lj_assertJ(irt_toitype_(IRT_P64) == LJ_TTRACE, "mismatched type mapping");
  ir->t.irt = IRT_P64;
  ir->o = LJ_GC64 ? IR_KNUM : IR_KNULL;  /* Not IR_KGC yet, but same size. */
  ir->op12 = 0;
  ir->prev = 0;
  return TREF(ref, IRT_P64);
}